

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::BeginRead3dmTable(ON_BinaryArchive *this,uint typecode)

{
  bool bVar1;
  bool bVar2;
  ON_3dmArchiveTableType table;
  ON__UINT32 table_record_tcode;
  char *sFormat;
  int line_number;
  ON_ClassId *this_00;
  ON_UUID class_uuid;
  ON__UINT64 OStackY_40;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  
  if (this->m_mode != read3dm) {
    sFormat = "ON_BinaryArchive::BeginRead3dmTable() ON::archive_mode::read3dm != Mode()";
    line_number = 0x22d0;
LAB_003ce5d7:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  if (typecode == 0) {
    sFormat = "ON_BinaryArchive::BeginRead3dmTable() bad typecode";
    line_number = 0x22d6;
    goto LAB_003ce5d7;
  }
  table = TableTypeFromTypecode(this,typecode);
  if (table == Unset) {
    sFormat = "ON_BinaryArchive::BeginRead3dmTable() bad typecode";
    line_number = 0x22dd;
    goto LAB_003ce5d7;
  }
  if (table < (settings_table|start_section)) {
    sFormat = 
    "ON_BinaryArchive::BeginRead3dmTable cannot be used for start, properties, or settings table.";
    line_number = 0x22e5;
    goto LAB_003ce5d7;
  }
  bVar1 = ArchiveContains3dmTable(this,table);
  if (!bVar1) {
    if (typecode == 0x10000017 || table == user_table) {
      return false;
    }
    bVar1 = Begin3dmTable(this,read3dm,table);
    return bVar1;
  }
  if (this->m_3dm_version < 2) {
    bVar1 = SeekFromStart(this,0x20);
    bVar2 = Begin3dmTable(this,read3dm,table);
    if (bVar1) {
      return bVar1;
    }
    if (!bVar2) {
      return bVar1;
    }
    goto switchD_003ce724_caseD_10000014;
  }
  tcode = 0;
  big_value = 0;
  bVar1 = PeekAt3dmBigChunkType(this,&tcode,&big_value);
  if (!bVar1) {
    return false;
  }
  if (tcode != typecode) {
    if (typecode == 0x10000017 || table == user_table) {
      return false;
    }
    if ((tcode & 0xfffff000) != 0x10000000) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x2317,"","tcode is not a table typecode. File is badly corrupted.");
      Internal_ReportCriticalError(this);
      return false;
    }
    if ((((typecode == 0x10000021) && (tcode == 0x10000022)) && (this->m_3dm_version == 3)) &&
       (0xbf1f0c5 < this->m_3dm_opennurbs_version)) {
      tcode = 0;
      big_value = 0;
      bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
      if (bVar1) {
        bVar1 = EndRead3dmChunk(this);
        tcode = 0;
        if (bVar1) {
          big_value = 0;
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x234b,"",
                 "ON_BinaryArchive::BeginRead3dmTable() - current file position not at start of table - searching"
                );
      bVar1 = Seek3dmChunkFromStart(this,typecode);
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = Begin3dmTable(this,read3dm,table);
  if (!bVar1) {
    return false;
  }
  tcode = 0;
  big_value = 0;
  bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
  if ((!bVar1) || (tcode == typecode)) goto LAB_003cea1b;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,0x2359,"","ON_BinaryArchive::BeginRead3dmTable() - corrupt table - skipping");
  bVar1 = EndRead3dmChunk(this);
  if ((!bVar1) || (0x16 < typecode + 0xeffffff0)) goto switchD_003ce724_caseD_10000014;
  class_uuid = (ON_UUID)ZEXT816((ulong)0);
  switch(typecode) {
  case 0x10000010:
    class_uuid = ON_ClassId::Uuid(&ON_Material::m_ON_Material_class_rtti);
    table_record_tcode = 0x20008040;
    OStackY_40 = 0x72;
    break;
  case 0x10000011:
    class_uuid = ON_ClassId::Uuid(&ON_Layer::m_ON_Layer_class_rtti);
    table_record_tcode = 0x20008050;
    goto LAB_003ce96d;
  case 0x10000012:
    class_uuid = ON_ClassId::Uuid(&ON_Light::m_ON_Light_class_rtti);
    table_record_tcode = 0x20008060;
    goto LAB_003ce96d;
  case 0x10000013:
    table_record_tcode = 0x20008070;
    OStackY_40 = 0x1a;
    break;
  default:
    goto switchD_003ce724_caseD_10000014;
  case 0x10000016:
    table_record_tcode = 0x20008090;
    OStackY_40 = 0x28;
    class_uuid = (ON_UUID)ZEXT816((ulong)0);
    break;
  case 0x10000018:
    class_uuid = ON_ClassId::Uuid(&ON_Group::m_ON_Group_class_rtti);
    table_record_tcode = 0x20008073;
    goto LAB_003ce893;
  case 0x10000019:
    class_uuid = ON_ClassId::Uuid(&ON_TextStyle::m_ON_TextStyle_class_rtti);
    table_record_tcode = 0x20008074;
    goto LAB_003ce96d;
  case 0x10000020:
    if (this->m_3dm_version < 0x3c) {
      this_00 = &ON_V5x_DimStyle::m_ON_V5x_DimStyle_class_rtti;
    }
    else {
      this_00 = &ON_DimStyle::m_ON_DimStyle_class_rtti;
    }
    class_uuid = ON_ClassId::Uuid(this_00);
    table_record_tcode = 0x20008075;
    goto LAB_003ce96d;
  case 0x10000021:
    class_uuid = ON_ClassId::Uuid(&ON_InstanceDefinition::m_ON_InstanceDefinition_class_rtti);
    table_record_tcode = 0x20008076;
    goto LAB_003ce96d;
  case 0x10000022:
    class_uuid = ON_ClassId::Uuid(&ON_HatchPattern::m_ON_HatchPattern_class_rtti);
    table_record_tcode = 0x20008077;
LAB_003ce96d:
    OStackY_40 = 0x1e;
    break;
  case 0x10000023:
    class_uuid = ON_ClassId::Uuid(&ON_Linetype::m_ON_Linetype_class_rtti);
    table_record_tcode = 0x20008078;
LAB_003ce893:
    OStackY_40 = 0x14;
    break;
  case 0x10000025:
    class_uuid = ON_ClassId::Uuid(&ON_TextureMapping::m_ON_TextureMapping_class_rtti);
    table_record_tcode = 0x2000807a;
    OStackY_40 = 0x230;
    break;
  case 0x10000026:
    class_uuid = ON_ClassId::Uuid(&ON_HistoryRecord::m_ON_HistoryRecord_class_rtti);
    table_record_tcode = 0x2000807b;
    OStackY_40 = 0x108;
  }
  bVar1 = FindMisplacedTable(this,0,typecode,table_record_tcode,class_uuid,OStackY_40);
  if (bVar1) {
    tcode = 0;
    big_value = 0;
    bVar1 = PeekAt3dmBigChunkType(this,&tcode,&big_value);
    if ((bVar1) && (tcode == typecode)) {
      End3dmTable(this,table,true);
      this->m_3dm_previous_table = settings_table;
      bVar1 = Begin3dmTable(this,read3dm,table);
      if (bVar1) {
        tcode = 0;
        big_value = 0;
        bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
        if ((bVar1) && (tcode != typecode)) {
          EndRead3dmChunk(this);
          End3dmTable(this,table,false);
        }
        else {
LAB_003cea1b:
          if (bVar1 != false) {
            return true;
          }
        }
      }
    }
  }
switchD_003ce724_caseD_10000014:
  End3dmTable(this,table,false);
  return false;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmTable( unsigned int typecode )
{
  bool rc = false;
  if (ON::archive_mode::read3dm != Mode())
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() ON::archive_mode::read3dm != Mode()");
    return false;
  }

  if (0 == typecode) 
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() bad typecode");
    return false;
  }

  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset) 
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() bad typecode");
    return false;
  }

  const bool bUserTable = ( TCODE_USER_TABLE == typecode || ON_3dmArchiveTableType::user_table == tt );

  if (static_cast<unsigned int>(tt) <= static_cast<unsigned int>(ON_3dmArchiveTableType::settings_table))
  {
    ON_ERROR("ON_BinaryArchive::BeginRead3dmTable cannot be used for start, properties, or settings table.");
    return false;
  }

  if (false == ArchiveContains3dmTable(tt))
  {
    // table type was added after the code that wrote the
    // file was compiled or after this code was compiled.
    if ( bUserTable )
      return false; // false for user tables

    // true for the other tabelss if things are as they should be
    return Begin3dmTable(ON::archive_mode::read3dm,tt);
  }

  if ( m_3dm_version <= 1 ) 
  {
      // version 1 files had can have chunks in any order.  To read a "table",
      // you have to go through the entire list of chunks looking for those
      // that belong to a particular table.
      rc = SeekFromStart(32)?true:false;
      if (Begin3dmTable(ON::archive_mode::read3dm, tt))
      {
        if (false == rc)
          End3dmTable(tt, false);
      }
      return rc;
  }

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  rc = PeekAt3dmBigChunkType( &tcode, &big_value );
  if ( rc )
  {
    if ( tcode != typecode ) 
    {
      if ( bUserTable ) 
      {
        // it's ok to not have user tables
        return false;
      }

      const bool bIsTableTypeCode = (TCODE_TABLE == (0xFFFFF000 & tcode));
      if (false == bIsTableTypeCode)
      {
        // Dale Lear - Nov 8 2022 - ships in Rhino 8.2
        // Fix https://mcneel.myjetbrains.com/youtrack/issue/RH-77657
        // (detecting corruption in table headers prevents hangs).
        // This value isn't a table typecode (even from a table added int the future).
        // The file is badly corrupt at this point and we have to quit.
        ON_ERROR("tcode is not a table typecode. File is badly corrupted.");
        this->Internal_ReportCriticalError();
        return false;
      }

      // A required table is not at the current position in the archive
      // see if we can find it someplace else in the archive.  This can
      // happen when old code encounters a table that was added later.

      bool bSeekFromStart = true;

      if (   TCODE_HATCHPATTERN_TABLE == tcode
          && TCODE_INSTANCE_DEFINITION_TABLE == typecode
          && 3 == m_3dm_version 
          && 200405190 <= m_3dm_opennurbs_version )
      {
        // Dale Lear
        //   V3 files from 19 may 2004 on contained bogus hatch pattern tables
        //   where the instance definition table was supposed to be.
        //
        // Do not set rc in this code.  The goal of this code is to
        // avoid seeking from the start of the file and posting
        // an ON_ERROR alert about something we can work around
        // and has been fixed in V4.
        bSeekFromStart = false;
        tcode = 0;
        big_value = 0;
        if (BeginRead3dmBigChunk(&tcode, &big_value))
        {
          if (EndRead3dmChunk())
          {
            tcode = 0;
            big_value = 0;
            if (TCODE_HATCHPATTERN_TABLE == tcode)
            {
              // We've skipped the incorrectly positioned hatch pattern table.
              // If we're lucking we are at the start of the correct table.
              PeekAt3dmBigChunkType(&tcode, &big_value);
              if (tcode != typecode)
              {
                // We're not lucky.
                bSeekFromStart = true;
              }
            }
          }
          else
            tcode = 0;            
        }
      }

      if ( bSeekFromStart )
      {
        ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() - current file position not at start of table - searching");
        rc = Seek3dmChunkFromStart( typecode );
      }
    }
    if ( rc ) 
    {
      rc = Begin3dmTable(ON::archive_mode::read3dm,tt);
      if (rc)
      {
        tcode = 0;
        big_value = 0;
        rc = BeginRead3dmBigChunk(&tcode, &big_value);
        if (rc && tcode != typecode)
        {
          ON_ERROR("ON_BinaryArchive::BeginRead3dmTable() - corrupt table - skipping");
          rc = false;
          if (EndRead3dmChunk())
          {
            // 1 November 2005 Dale Lear
            //    This fall back is slow but it has been finding
            //    layer and object tables in damaged files.  I'm
            //    adding it to the other BeginRead3dm...Table()
            //    functions when it makes sense.

            ON__UINT64 filelength = 0;
            ON__UINT32 table_record_record = 0;
            ON_UUID class_uuid = ON_nil_uuid;
            ON__UINT64 min_length_data = 0;
            switch (typecode)
            {
            case TCODE_BITMAP_TABLE:
              table_record_record = TCODE_BITMAP_RECORD;
              class_uuid = ON_nil_uuid;  // multiple types of opennurbs objects in bitmap tables
              min_length_data = 40;
              break;

            case TCODE_TEXTURE_MAPPING_TABLE:
              table_record_record = TCODE_TEXTURE_MAPPING_RECORD;
              class_uuid = ON_CLASS_ID(ON_TextureMapping);
              min_length_data = sizeof(ON_TextureMapping);
              break;

            case TCODE_MATERIAL_TABLE:
              table_record_record = TCODE_MATERIAL_RECORD;
              class_uuid = ON_CLASS_ID(ON_Material);
              min_length_data = 114;
              break;

            case TCODE_LINETYPE_TABLE:
              table_record_record = TCODE_LINETYPE_RECORD;
              class_uuid = ON_CLASS_ID(ON_Linetype);
              min_length_data = 20;
              break;

            case TCODE_LAYER_TABLE:
              table_record_record = TCODE_LAYER_RECORD;
              class_uuid = ON_CLASS_ID(ON_Layer);
              min_length_data = 30;
              break;

            case TCODE_GROUP_TABLE:
              table_record_record = TCODE_GROUP_RECORD;
              class_uuid = ON_CLASS_ID(ON_Group);
              min_length_data = 20;
              break;

            case TCODE_FONT_TABLE:
              table_record_record = TCODE_FONT_RECORD;
              class_uuid = ON_CLASS_ID(ON_TextStyle);
              min_length_data = 30;
              break;

            case TCODE_DIMSTYLE_TABLE:
              table_record_record = TCODE_DIMSTYLE_RECORD;
              class_uuid 
                = (m_3dm_version >= 60)
                ? ON_CLASS_ID(ON_DimStyle)
                : ON_CLASS_ID(ON_V5x_DimStyle);
              min_length_data = 30;
              break;

            case TCODE_LIGHT_TABLE:
              table_record_record = TCODE_LIGHT_RECORD;
              class_uuid = ON_CLASS_ID(ON_Light);
              min_length_data = 30;
              break;

            case TCODE_HATCHPATTERN_TABLE:
              table_record_record = TCODE_HATCHPATTERN_RECORD;
              class_uuid = ON_CLASS_ID(ON_HatchPattern);
              min_length_data = 30;
              break;

            case TCODE_INSTANCE_DEFINITION_TABLE:
              table_record_record = TCODE_INSTANCE_DEFINITION_RECORD;
              class_uuid = ON_CLASS_ID(ON_InstanceDefinition);
              min_length_data = 30;
              break;

            case TCODE_OBJECT_TABLE:
              table_record_record = TCODE_OBJECT_RECORD;
              class_uuid = ON_nil_uuid; // multiple object types in this table
              min_length_data = 26; // ON_Point data is 3 doubles + 2 byte version number
              break;

            case TCODE_HISTORYRECORD_TABLE:
              table_record_record = TCODE_HISTORYRECORD_RECORD;
              class_uuid = ON_CLASS_ID(ON_HistoryRecord);
              min_length_data = sizeof(ON_HistoryRecord);
              break;

            default:
              break;
            }

            if (
              0 != table_record_record 
              && min_length_data > 0 
              )
            {
              if ( FindMisplacedTable(filelength, typecode, table_record_record, class_uuid, min_length_data) )
              {
                tcode = 0;
                big_value = 0;
                if (PeekAt3dmBigChunkType(&tcode, &big_value))
                {
                  if (tcode == typecode)
                  {
                    // try one last time
                    End3dmTable(tt,true);
                    m_3dm_previous_table = ON_3dmArchiveTableType::settings_table;
                    rc = Begin3dmTable(ON::archive_mode::read3dm, tt);
                    if (rc)
                    {
                      tcode = 0;
                      big_value = 0;
                      rc = BeginRead3dmBigChunk(&tcode, &big_value);
                      if (rc)
                      {
                        if (tcode != typecode)
                        {
                          EndRead3dmChunk();
                          rc = false;
                          End3dmTable(tt, false);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ( false == rc )
          End3dmTable(tt,false);
      }
    }
  }
  
  return rc;
}